

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageOperators.cpp
# Opt level: O1

void __thiscall
helics::MessageConditionalOperator::MessageConditionalOperator
          (MessageConditionalOperator *this,
          function<bool_(const_helics::Message_*)> *userConditionalFunction)

{
  undefined8 uVar1;
  
  (this->super_FilterOperator)._vptr_FilterOperator =
       (_func_int **)&PTR__MessageConditionalOperator_00551f80;
  *(undefined8 *)&(this->evalFunction).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->evalFunction).super__Function_base._M_functor + 8) = 0;
  (this->evalFunction).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->evalFunction)._M_invoker = userConditionalFunction->_M_invoker;
  if ((userConditionalFunction->super__Function_base)._M_manager != (_Manager_type)0x0) {
    uVar1 = *(undefined8 *)((long)&(userConditionalFunction->super__Function_base)._M_functor + 8);
    *(undefined8 *)&(this->evalFunction).super__Function_base._M_functor =
         *(undefined8 *)&(userConditionalFunction->super__Function_base)._M_functor;
    *(undefined8 *)((long)&(this->evalFunction).super__Function_base._M_functor + 8) = uVar1;
    (this->evalFunction).super__Function_base._M_manager =
         (userConditionalFunction->super__Function_base)._M_manager;
    (userConditionalFunction->super__Function_base)._M_manager = (_Manager_type)0x0;
    userConditionalFunction->_M_invoker = (_Invoker_type)0x0;
  }
  return;
}

Assistant:

MessageConditionalOperator::MessageConditionalOperator(
    std::function<bool(const Message*)> userConditionalFunction):
    evalFunction(std::move(userConditionalFunction))
{
}